

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O2

void tx_block_yrd(AV1_COMP *cpi,MACROBLOCK *x,int blk_row,int blk_col,int block,TX_SIZE tx_size,
                 BLOCK_SIZE plane_bsize,int depth,ENTROPY_CONTEXT *above_ctx,
                 ENTROPY_CONTEXT *left_ctx,TXFM_CONTEXT *tx_above,TXFM_CONTEXT *tx_left,
                 int64_t ref_best_rd,RD_STATS *rd_stats,FAST_TX_SEARCH_MODE ftxs_mode)

{
  MACROBLOCKD *xd;
  uint8_t *puVar1;
  TX_SIZE TVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  MB_MODE_INFO *pMVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  int plane;
  long lVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  TXB_CTX txb_ctx;
  
  xd = &x->e_mbd;
  uVar14 = (ulong)plane_bsize;
  iVar8 = max_block_high(xd,plane_bsize,blk_row);
  iVar9 = max_block_wide(xd,plane_bsize,plane);
  iVar17 = iVar8 - blk_row;
  iVar10 = iVar9 - blk_col;
  if ((iVar10 != 0 && blk_col <= iVar9) && (iVar17 != 0 && blk_row <= iVar8)) {
    pMVar6 = *(x->e_mbd).mi;
    TVar2 = pMVar6->inter_tx_size
            [(blk_col >> (av1_get_txb_size_index_tw_w_log2_table[uVar14] & 0x1f)) +
             ((blk_row >> (av1_get_txb_size_index_tw_h_log2_table[uVar14] & 0x1f)) <<
             (av1_get_txb_size_index_stride_log2_table[uVar14] & 0x1f))];
    uVar11 = (uint)tx_size;
    iVar8 = txfm_partition_context(tx_above + blk_col,tx_left + blk_row,pMVar6->bsize,tx_size);
    cVar7 = (char)uVar11;
    rd_stats->rate = 0;
    rd_stats->zero_rate = 0;
    rd_stats->sse = 0;
    rd_stats->dist = 0;
    rd_stats->rdcost = 0;
    rd_stats->skip_txfm = '\x01';
    if (TVar2 == tx_size) {
      bVar3 = ""[tx_size];
      bVar4 = ""[tx_size];
      get_txb_ctx(plane_bsize,tx_size,0,above_ctx + blk_col,left_ctx + blk_row,&txb_ctx);
      iVar17 = (x->coeff_costs).coeff_costs[(uint)bVar3 + (uint)bVar4 + 1 >> 1 & 0xff][0].
               txb_skip_cost[txb_ctx.txb_skip_ctx][1];
      rd_stats->zero_rate = iVar17;
      tx_type_rd(cpi,x,tx_size,blk_row,blk_col,block,(uint)plane_bsize,&txb_ctx,rd_stats,'\0',
                 ref_best_rd);
      bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar14];
      if ((rd_stats->dist * 0x80 + ((long)rd_stats->rate * (long)x->rdmult + 0x100 >> 9) <
           rd_stats->sse * 0x80 + ((long)x->rdmult * (long)iVar17 + 0x100 >> 9)) &&
         (rd_stats->skip_txfm != '\x01')) {
        rd_stats->skip_txfm = '\0';
        puVar1 = (x->txfm_search_info).blk_skip + (int)((uint)bVar3 * blk_row + blk_col);
        *puVar1 = *puVar1 & 0xfe;
      }
      else {
        rd_stats->rate = iVar17;
        rd_stats->dist = rd_stats->sse;
        rd_stats->skip_txfm = '\x01';
        puVar1 = (x->txfm_search_info).blk_skip + (int)((uint)bVar3 * blk_row + blk_col);
        *puVar1 = *puVar1 | 1;
        x->plane[0].eobs[block] = 0;
        x->plane[0].txb_entropy_ctx[block] = '\0';
        update_txk_array(xd,blk_row,blk_col,tx_size,'\0');
      }
      if (depth < 2 && cVar7 != '\0') {
        rd_stats->rate = rd_stats->rate + (x->mode_costs).txfm_partition_cost[iVar8][0];
      }
      uVar11 = (uint)x->plane[0].txb_entropy_ctx[block];
      memset(above_ctx + blk_col,uVar11,
             (long)*(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4)));
      memset(left_ctx + blk_row,uVar11,
             (long)*(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4)));
      txfm_partition_update(tx_above + blk_col,tx_left + blk_row,tx_size,tx_size);
    }
    else {
      bVar3 = ""[tx_size];
      iVar9 = tx_size_wide_unit[bVar3];
      iVar5 = tx_size_high_unit[bVar3];
      if (tx_size_high_unit[tx_size] < iVar17) {
        iVar17 = tx_size_high_unit[tx_size];
      }
      if (tx_size_wide_unit[tx_size] < iVar10) {
        iVar10 = tx_size_wide_unit[tx_size];
      }
      lVar12 = 0;
      for (iVar16 = 0; iVar16 < iVar17; iVar16 = iVar16 + iVar5) {
        for (iVar15 = 0; iVar15 < iVar10; iVar15 = iVar15 + iVar9) {
          txb_ctx.txb_skip_ctx = 0;
          txb_ctx.dc_sign_ctx = 0;
          tx_block_yrd(cpi,x,blk_row + iVar16,blk_col + iVar15,block,bVar3,plane_bsize,depth + 1,
                       above_ctx,left_ctx,tx_above,tx_left,ref_best_rd - lVar12,(RD_STATS *)&txb_ctx
                       ,(FAST_TX_SEARCH_MODE)uVar11);
          lVar13 = (long)txb_ctx.txb_skip_ctx;
          if (lVar13 == 0x7fffffff) {
            rd_stats->rate = 0x7fffffff;
            rd_stats->zero_rate = 0;
            rd_stats->dist = 0x7fffffffffffffff;
            rd_stats->rdcost = 0x7fffffffffffffff;
            rd_stats->sse = 0x7fffffffffffffff;
            rd_stats->skip_txfm = '\0';
            return;
          }
          av1_merge_rd_stats(rd_stats,(RD_STATS *)&txb_ctx);
          lVar12 = lVar12 + (x->rdmult * lVar13 + 0x100 >> 9);
          block = block + iVar5 * iVar9;
        }
      }
      if (depth < 2 && (char)uVar11 != '\0') {
        rd_stats->rate = rd_stats->rate + (x->mode_costs).txfm_partition_cost[iVar8][1];
      }
    }
  }
  return;
}

Assistant:

static inline void tx_block_yrd(const AV1_COMP *cpi, MACROBLOCK *x, int blk_row,
                                int blk_col, int block, TX_SIZE tx_size,
                                BLOCK_SIZE plane_bsize, int depth,
                                ENTROPY_CONTEXT *above_ctx,
                                ENTROPY_CONTEXT *left_ctx,
                                TXFM_CONTEXT *tx_above, TXFM_CONTEXT *tx_left,
                                int64_t ref_best_rd, RD_STATS *rd_stats,
                                FAST_TX_SEARCH_MODE ftxs_mode) {
  assert(tx_size < TX_SIZES_ALL);
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(is_inter_block(mbmi));
  const int max_blocks_high = max_block_high(xd, plane_bsize, 0);
  const int max_blocks_wide = max_block_wide(xd, plane_bsize, 0);

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;

  const TX_SIZE plane_tx_size = mbmi->inter_tx_size[av1_get_txb_size_index(
      plane_bsize, blk_row, blk_col)];
  const int ctx = txfm_partition_context(tx_above + blk_col, tx_left + blk_row,
                                         mbmi->bsize, tx_size);

  av1_init_rd_stats(rd_stats);
  if (tx_size == plane_tx_size) {
    ENTROPY_CONTEXT *ta = above_ctx + blk_col;
    ENTROPY_CONTEXT *tl = left_ctx + blk_row;
    const TX_SIZE txs_ctx = get_txsize_entropy_ctx(tx_size);
    TXB_CTX txb_ctx;
    get_txb_ctx(plane_bsize, tx_size, 0, ta, tl, &txb_ctx);

    const int zero_blk_rate =
        x->coeff_costs.coeff_costs[txs_ctx][get_plane_type(0)]
            .txb_skip_cost[txb_ctx.txb_skip_ctx][1];
    rd_stats->zero_rate = zero_blk_rate;
    tx_type_rd(cpi, x, tx_size, blk_row, blk_col, block, plane_bsize, &txb_ctx,
               rd_stats, ftxs_mode, ref_best_rd);
    const int mi_width = mi_size_wide[plane_bsize];
    TxfmSearchInfo *txfm_info = &x->txfm_search_info;
    if (RDCOST(x->rdmult, rd_stats->rate, rd_stats->dist) >=
            RDCOST(x->rdmult, zero_blk_rate, rd_stats->sse) ||
        rd_stats->skip_txfm == 1) {
      rd_stats->rate = zero_blk_rate;
      rd_stats->dist = rd_stats->sse;
      rd_stats->skip_txfm = 1;
      set_blk_skip(txfm_info->blk_skip, 0, blk_row * mi_width + blk_col, 1);
      x->plane[0].eobs[block] = 0;
      x->plane[0].txb_entropy_ctx[block] = 0;
      update_txk_array(xd, blk_row, blk_col, tx_size, DCT_DCT);
    } else {
      rd_stats->skip_txfm = 0;
      set_blk_skip(txfm_info->blk_skip, 0, blk_row * mi_width + blk_col, 0);
    }
    if (tx_size > TX_4X4 && depth < MAX_VARTX_DEPTH)
      rd_stats->rate += x->mode_costs.txfm_partition_cost[ctx][0];
    av1_set_txb_context(x, 0, block, tx_size, ta, tl);
    txfm_partition_update(tx_above + blk_col, tx_left + blk_row, tx_size,
                          tx_size);
  } else {
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    const int txb_width = tx_size_wide_unit[sub_txs];
    const int txb_height = tx_size_high_unit[sub_txs];
    const int step = txb_height * txb_width;
    const int row_end =
        AOMMIN(tx_size_high_unit[tx_size], max_blocks_high - blk_row);
    const int col_end =
        AOMMIN(tx_size_wide_unit[tx_size], max_blocks_wide - blk_col);
    RD_STATS pn_rd_stats;
    int64_t this_rd = 0;
    assert(txb_width > 0 && txb_height > 0);

    for (int row = 0; row < row_end; row += txb_height) {
      const int offsetr = blk_row + row;
      for (int col = 0; col < col_end; col += txb_width) {
        const int offsetc = blk_col + col;

        av1_init_rd_stats(&pn_rd_stats);
        tx_block_yrd(cpi, x, offsetr, offsetc, block, sub_txs, plane_bsize,
                     depth + 1, above_ctx, left_ctx, tx_above, tx_left,
                     ref_best_rd - this_rd, &pn_rd_stats, ftxs_mode);
        if (pn_rd_stats.rate == INT_MAX) {
          av1_invalid_rd_stats(rd_stats);
          return;
        }
        av1_merge_rd_stats(rd_stats, &pn_rd_stats);
        this_rd += RDCOST(x->rdmult, pn_rd_stats.rate, pn_rd_stats.dist);
        block += step;
      }
    }

    if (tx_size > TX_4X4 && depth < MAX_VARTX_DEPTH)
      rd_stats->rate += x->mode_costs.txfm_partition_cost[ctx][1];
  }
}